

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void guess_ca_certs(char *filename,X509_NAME *issuer_name,X509 **sigc,X509 **encc,X509 **issuer_cert
                   )

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  X509 *pXVar4;
  X509_NAME *pXVar5;
  X509_NAME *b;
  char *pcVar6;
  char local_908 [8];
  char buffer [1024];
  ASN1_BIT_STRING *usage;
  X509_NAME *issuer;
  int is_issuer;
  X509_NAME *myname;
  char name [1024];
  X509 *cert [20];
  int local_3c;
  int local_38;
  int j;
  int i;
  int ccnt;
  X509 **issuer_cert_local;
  X509 **encc_local;
  X509 **sigc_local;
  X509_NAME *issuer_name_local;
  char *filename_local;
  
  for (j = 0; j < 0x14; j = j + 1) {
    snprintf((char *)&myname,0x3ff,"%s-%d",filename,(ulong)(uint)j);
    pXVar4 = read_cert((char *)&myname);
    cert[(long)j + -1] = pXVar4;
    if (pXVar4 == (X509 *)0x0) break;
  }
  *encc = (X509 *)name._1016_8_;
  *sigc = (X509 *)name._1016_8_;
  local_38 = 0;
  do {
    if (j <= local_38) {
      for (local_38 = 0; pcVar2 = pname, local_38 < j; local_38 = local_38 + 1) {
        if (((cert[(long)local_38 + -1] != *sigc) && (cert[(long)local_38 + -1] != *encc)) &&
           (cert[(long)local_38 + -1] != *issuer_cert)) {
          X509_free((X509 *)cert[(long)local_38 + -1]);
        }
      }
      if (v_flag != 0) {
        if (*sigc != (X509 *)0x0) {
          pXVar5 = X509_get_subject_name((X509 *)*sigc);
          pcVar6 = X509_NAME_oneline(pXVar5,local_908,0x400);
          printf("%s: using RA certificate: %s\n",pcVar2,pcVar6);
        }
        pcVar2 = pname;
        if (*encc != (X509 *)0x0) {
          pXVar5 = X509_get_subject_name((X509 *)*encc);
          pcVar6 = X509_NAME_oneline(pXVar5,local_908,0x400);
          printf("%s: using RA encryption certificate: %s\n",pcVar2,pcVar6);
        }
        pcVar2 = pname;
        if (*issuer_cert != (X509 *)0x0) {
          pXVar5 = X509_get_subject_name((X509 *)*issuer_cert);
          pcVar6 = X509_NAME_oneline(pXVar5,local_908,0x400);
          printf("%s: using issuer certificate: %s\n",pcVar2,pcVar6);
        }
      }
      return;
    }
    pXVar5 = X509_get_subject_name((X509 *)cert[(long)local_38 + -1]);
    bVar1 = false;
    for (local_3c = 0; local_3c < j; local_3c = local_3c + 1) {
      b = X509_get_issuer_name((X509 *)cert[(long)local_3c + -1]);
      iVar3 = X509_NAME_cmp(pXVar5,b);
      if (iVar3 == 0) {
        bVar1 = true;
        break;
      }
    }
    if ((issuer_name != (X509_NAME *)0x0) &&
       (iVar3 = X509_NAME_cmp((X509_NAME *)issuer_name,pXVar5), iVar3 == 0)) {
      *issuer_cert = cert[(long)local_38 + -1];
    }
    if (!bVar1) {
      buffer._1016_8_ =
           X509_get_ext_d2i((X509 *)cert[(long)local_38 + -1],0x53,(int *)0x0,(int *)0x0);
      if (((int *)buffer._1016_8_ == (int *)0x0) || (*(int *)buffer._1016_8_ < 1)) {
        pXVar4 = cert[(long)local_38 + -1];
        *encc = pXVar4;
        *sigc = pXVar4;
      }
      else {
        if ((**(byte **)(buffer._1016_8_ + 8) & 0x80) != 0) {
          *sigc = cert[(long)local_38 + -1];
        }
        if ((**(byte **)(buffer._1016_8_ + 8) & 0x20) != 0) {
          *encc = cert[(long)local_38 + -1];
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void
guess_ca_certs(const char* filename, X509_NAME *issuer_name,
			   X509 **sigc, X509 **encc, X509 **issuer_cert)
{
	int ccnt, i, j;
	X509 *cert[20];

	ccnt = 0;
	/* read all certificates */
	while (ccnt < 20) {
		char name[1024];

		snprintf(name, sizeof(name)-1, "%s-%d", filename, ccnt);
		if (!(cert[ccnt] = read_cert(name)))
			break;

		ccnt++;
	}

	/* this is either NULL or the first certificate */
	*sigc = *encc = cert[0];

	for (i = 0; i < ccnt; i++) {
		X509_NAME *myname = X509_get_subject_name(cert[i]);
		int is_issuer = 0;

		/* the right CA is the final-one, either leaf or not */
		for (j = 0; j < ccnt; j++) {
			X509_NAME *issuer = X509_get_issuer_name(cert[j]);
			if (!X509_NAME_cmp(myname, issuer)) {
				is_issuer = 1;
				break;
			}
		}

		if (issuer_name != NULL && !X509_NAME_cmp(issuer_name, myname))
			*issuer_cert = cert[i];

		if (!is_issuer) {
			/* X509_get_key_usage(cert[i]) is not in older openssl */
			ASN1_BIT_STRING *usage = X509_get_ext_d2i(cert[i], NID_key_usage, NULL, NULL);
			if (usage && (usage->length > 0)) {
				if (usage->data[0] & KU_DIGITAL_SIGNATURE)
					*sigc = cert[i];
				if (usage->data[0] & KU_KEY_ENCIPHERMENT)
					*encc = cert[i];
			} else {
				/* no usability constraints */
				*sigc = *encc = cert[i];
			}
		}
	}

	/* release those we don't use */
	for (i = 0; i < ccnt; i++) {
		if (cert[i] != *sigc && cert[i] != *encc && cert[i] != *issuer_cert)
			X509_free(cert[i]);
	}

	if (v_flag) {
		char buffer[1024];

		if (*sigc)
			printf("%s: using RA certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*sigc),
						buffer, sizeof(buffer)));
		if (*encc)
			printf("%s: using RA encryption certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*encc),
						buffer, sizeof(buffer)));
		if (*issuer_cert)
			printf("%s: using issuer certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*issuer_cert),
						buffer, sizeof(buffer)));
	}

}